

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

ssize_t __thiscall StreamInfo::read(StreamInfo *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  AbstractReader *pAVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  uint local_1c;
  StreamInfo *pSStack_18;
  int readRez;
  StreamInfo *this_local;
  
  local_1c = 0;
  pSStack_18 = this;
  if ((((this->m_asyncMode & 1U) != 0) && ((this->m_notificated & 1U) == 0)) &&
     ((this->m_isEOF & 1U) == 0)) {
    pAVar2 = this->m_dataReader;
    uVar1 = this->m_readerID;
    uVar3 = (*this->m_dataReader->_vptr_AbstractReader[0xc])
                      (this->m_dataReader,CONCAT44(in_register_00000034,__fd));
    (*pAVar2->_vptr_AbstractReader[5])(pAVar2,(ulong)uVar1,(ulong)uVar3);
    this->m_notificated = true;
  }
  if (this->m_lastAVRez != 0) {
    if ((this->m_isEOF & 1U) != 0) {
      this->m_blockSize = 0;
      this_local._4_4_ = 3;
      goto LAB_002d5fc4;
    }
    this->m_lastAVRez = 0;
    iVar4 = (*this->m_dataReader->_vptr_AbstractReader[2])
                      (this->m_dataReader,(ulong)(uint)this->m_readerID,&this->m_blockSize,&local_1c
                       ,0);
    this->m_data = (uint8_t *)CONCAT44(extraout_var,iVar4);
    if ((local_1c == 2) || (local_1c == 4)) {
      this->m_lastAVRez = local_1c;
      this_local._4_4_ = local_1c;
      goto LAB_002d5fc4;
    }
    if (local_1c == 1) {
      this->m_isEOF = true;
    }
    (*(this->m_streamReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[4])
              (this->m_streamReader,this->m_data,(ulong)this->m_blockSize,(ulong)(this->m_isEOF & 1)
              );
    this->m_readCnt = (ulong)this->m_blockSize + this->m_readCnt;
    this->m_notificated = false;
  }
  this_local._4_4_ = local_1c;
LAB_002d5fc4:
  return (ulong)this_local._4_4_;
}

Assistant:

int StreamInfo::read()
{
    // m_readRez = 0;
    int readRez = 0;
    if (m_asyncMode && !m_notificated && !m_isEOF)
    {
        m_dataReader->notify(m_readerID, m_dataReader->getPreReadThreshold());
        m_notificated = true;
    }

    if (m_lastAVRez != 0)
    {
        if (m_isEOF)
        {
            m_blockSize = 0;
            return BufferedFileReader::DATA_EOF2;
        }
        m_lastAVRez = 0;

        m_data = m_dataReader->readBlock(m_readerID, m_blockSize, readRez);
        if (readRez == BufferedFileReader::DATA_NOT_READY || readRez == BufferedFileReader::DATA_DELAYED)
        {
            m_lastAVRez = readRez;
            return readRez;
        }
        if (readRez == BufferedFileReader::DATA_EOF)
            m_isEOF = true;
        m_streamReader->setBuffer(m_data, m_blockSize, m_isEOF);
        m_readCnt += m_blockSize;
        m_notificated = false;
    }
    return readRez;
}